

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::RegularExpression::replace
          (RegularExpression *this,XMLCh *matchString,XMLCh *replaceString,XMLSize_t start,
          XMLSize_t end,MemoryManager *manager)

{
  short *psVar1;
  XMLCh *__src;
  bool bVar2;
  int iVar3;
  uint uVar4;
  XMLSize_t index;
  BaseRefVectorOf<xercesc_4_0::Match> *this_00;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  RegularExpression *this_01;
  Op *pOVar6;
  undefined4 extraout_var_01;
  RuntimeException *this_02;
  int iVar7;
  RegularExpression *this_03;
  size_t __n;
  XMLSize_t getAt;
  XMLBuffer result;
  XMLBuffer local_78;
  Op *local_40;
  Token *local_38;
  
  lVar5 = 0;
  do {
    psVar1 = (short *)((long)&XMLUni::fgZeroLenString + lVar5);
    lVar5 = lVar5 + 2;
  } while (*psVar1 != 0);
  local_38 = (Token *)replaceString;
  bVar2 = matches(this,L"",0,(lVar5 >> 1) - 1,(Match *)0x0,manager);
  if (!bVar2) {
    this_00 = (BaseRefVectorOf<xercesc_4_0::Match> *)XMemory::operator_new(0x30,manager);
    this_00->_vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00401200;
    this_00->fAdoptedElems = true;
    this_00->fCurCount = 0;
    this_00->fMaxCount = 10;
    this_00->fElemList = (Match **)0x0;
    this_00->fMemoryManager = manager;
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,0x50);
    this_00->fElemList = (Match **)CONCAT44(extraout_var,iVar3);
    lVar5 = 0;
    do {
      this_00->fElemList[lVar5] = (Match *)0x0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 10);
    this_00->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00401188;
    allMatches(this,matchString,start,end,(RefVectorOf<xercesc_4_0::Match> *)this_00,manager);
    local_78.fIndex = 0;
    local_78.fCapacity = 0x3ff;
    local_78.fFullSize = 0;
    local_78.fUsed = false;
    local_78.fFullHandler = (XMLBufferFullHandler *)0x0;
    local_78.fMemoryManager = manager;
    local_40 = (Op *)end;
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,0x800);
    local_78.fBuffer = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    *local_78.fBuffer = L'\0';
    if (this_00->fCurCount != 0) {
      getAt = 0;
      do {
        this_01 = (RegularExpression *)BaseRefVectorOf<xercesc_4_0::Match>::elementAt(this_00,getAt)
        ;
        this_03 = this_01;
        iVar3 = Match::getStartPos((Match *)this_01,0);
        iVar7 = (int)start;
        if (iVar3 - iVar7 != 0 && iVar7 <= iVar3) {
          this_03 = (RegularExpression *)&local_78;
          XMLBuffer::append(&local_78,matchString + iVar7,(long)(iVar3 - iVar7));
        }
        subInExp(this_03,(XMLCh *)local_38,matchString,(Match *)this_01,&local_78,manager);
        uVar4 = Match::getEndPos((Match *)this_01,0);
        start = (XMLSize_t)uVar4;
        getAt = getAt + 1;
      } while (getAt < this_00->fCurCount);
    }
    pOVar6 = (Op *)(long)(int)start;
    if (pOVar6 <= local_40 && (long)local_40 - (long)pOVar6 != 0) {
      XMLBuffer::append(&local_78,matchString + (long)pOVar6,(long)local_40 - (long)pOVar6);
    }
    __src = local_78.fBuffer;
    local_78.fBuffer[local_78.fIndex] = L'\0';
    __n = 0;
    do {
      psVar1 = (short *)((long)local_78.fBuffer + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    memcpy((XMLCh *)CONCAT44(extraout_var_01,iVar3),__src,__n);
    (*(local_78.fMemoryManager)->_vptr_MemoryManager[4])(local_78.fMemoryManager,local_78.fBuffer);
    (*this_00->_vptr_BaseRefVectorOf[1])(this_00);
    return (XMLCh *)CONCAT44(extraout_var_01,iVar3);
  }
  this_02 = (RuntimeException *)__cxa_allocate_exception();
  RuntimeException::RuntimeException
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegularExpression.cpp"
             ,0x33f,Regex_RepPatMatchesZeroString,manager);
  __cxa_throw(this_02,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLCh* RegularExpression::replace(const XMLCh* const matchString,
                                  const XMLCh* const replaceString,
                                  const XMLSize_t start, const XMLSize_t end,
                                  MemoryManager* const manager) const
{
    // check if matches zero length string - throw error if so
    if(matches(XMLUni::fgZeroLenString, manager)){
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Regex_RepPatMatchesZeroString, manager);
    }

    RefVectorOf<Match> *subEx = new (manager) RefVectorOf<Match>(10, true, manager);
    Janitor<RefVectorOf<Match> > janSubEx(subEx);

    allMatches(matchString, start, end, subEx, manager);

    XMLBuffer result(1023, manager);
    int tokStart = (int)start;

    XMLSize_t i = 0;
    for(; i < subEx->size(); ++i) {
        Match *match = subEx->elementAt(i);
        int matchStart = match->getStartPos(0);

        if(matchStart > tokStart)
            result.append(matchString + tokStart, matchStart - tokStart);
        subInExp(replaceString, matchString, match, result, manager);

        tokStart = match->getEndPos(0);
    }

    if(end > (XMLSize_t)tokStart)
        result.append(matchString + tokStart, end - tokStart);

    return XMLString::replicate(result.getRawBuffer(), manager);
}